

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O3

int docast(void)

{
  boolean bVar1;
  int iVar2;
  undefined8 in_RAX;
  int spell_no;
  int local_4;
  
  local_4 = (int)((ulong)in_RAX >> 0x20);
  if (spl_book[0].sp_id == 0) {
    pline("You don\'t know any spells right now.");
  }
  else {
    bVar1 = dospellmenu("Choose which spell to cast",-2,&local_4);
    if (bVar1 != '\0') {
      iVar2 = spelleffects(local_4,'\0');
      return iVar2;
    }
  }
  return 0;
}

Assistant:

int docast(void)
{
	int spell_no;

	if (getspell(&spell_no))
	    return spelleffects(spell_no, FALSE);
	return 0;
}